

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rapidxml.hpp
# Opt level: O0

xml_node<char> * __thiscall
rapidxml::xml_document<char>::parse_cdata<0>(xml_document<char> *this,char **text)

{
  char *value_00;
  parse_error *this_00;
  xml_node<char> *this_01;
  bool bVar1;
  xml_node<char> *cdata;
  char *value;
  char **text_local;
  xml_document<char> *this_local;
  
  value_00 = *text;
  while( true ) {
    bVar1 = true;
    if (**text == ']') {
      bVar1 = true;
      if ((*text)[1] == ']') {
        bVar1 = (*text)[2] != '>';
      }
    }
    if (!bVar1) break;
    if (**text == '\0') {
      this_00 = (parse_error *)__cxa_allocate_exception(0x18);
      parse_error::parse_error(this_00,"unexpected end of data",*text);
      __cxa_throw(this_00,&parse_error::typeinfo,parse_error::~parse_error);
    }
    *text = *text + 1;
  }
  this_01 = memory_pool<char>::allocate_node
                      (&this->super_memory_pool<char>,node_cdata,(char *)0x0,(char *)0x0,0,0);
  xml_base<char>::value(&this_01->super_xml_base<char>,value_00,(long)*text - (long)value_00);
  **text = '\0';
  *text = *text + 3;
  return this_01;
}

Assistant:

xml_node<Ch> *parse_cdata(Ch *&text)
        {
            // If CDATA is disabled
            if (Flags & parse_no_data_nodes)
            {
                // Skip until end of cdata
                while (text[0] != Ch(']') || text[1] != Ch(']') || text[2] != Ch('>'))
                {
                    if (!text[0])
                        RAPIDXML_PARSE_ERROR("unexpected end of data", text);
                    ++text;
                }
                text += 3;      // Skip ]]>
                return 0;       // Do not produce CDATA node
            }

            // Skip until end of cdata
            Ch *value = text;
            while (text[0] != Ch(']') || text[1] != Ch(']') || text[2] != Ch('>'))
            {
                if (!text[0])
                    RAPIDXML_PARSE_ERROR("unexpected end of data", text);
                ++text;
            }

            // Create new cdata node
            xml_node<Ch> *cdata = this->allocate_node(node_cdata);
            cdata->value(value, text - value);

            // Place zero terminator after value
            if (!(Flags & parse_no_string_terminators))
                *text = Ch('\0');

            text += 3;      // Skip ]]>
            return cdata;
        }